

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_reader.h
# Opt level: O1

string_view __thiscall
absl::cord_internal::CordRepBtreeReader::Init(CordRepBtreeReader *this,CordRepBtree *tree)

{
  byte bVar1;
  size_t sVar2;
  CordRep *pCVar3;
  size_t sVar4;
  uint8_t *puVar5;
  CordRep *pCVar6;
  string_view sVar7;
  
  if (tree == (CordRepBtree *)0x0) {
    __assert_fail("tree != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree_reader.h"
                  ,0xa8,
                  "absl::string_view absl::cord_internal::CordRepBtreeReader::Init(CordRepBtree *)")
    ;
  }
  pCVar3 = CordRepBtreeNavigator::Init<(absl::cord_internal::CordRepBtree::EdgeType)0>
                     (&this->navigator_,tree);
  sVar2 = pCVar3->length;
  this->remaining_ = (tree->super_CordRep).length - sVar2;
  bVar1 = pCVar3->tag;
  if (bVar1 < 5) {
    pCVar6 = pCVar3;
    if (bVar1 == 1) {
      pCVar6 = *(CordRep **)&pCVar3[1].refcount;
    }
    if (pCVar6->tag < 5) {
      __assert_fail("IsDataEdge(edge)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                    ,0x2e,"absl::string_view absl::cord_internal::EdgeData(const CordRep *)");
    }
  }
  if (bVar1 == 1) {
    sVar4 = pCVar3[1].length;
    pCVar3 = *(CordRep **)&pCVar3[1].refcount;
  }
  else {
    sVar4 = 0;
  }
  bVar1 = pCVar3->tag;
  if (bVar1 < 6) {
    if (bVar1 != 5) {
      __assert_fail("IsExternal()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x36a,"const CordRepExternal *absl::cord_internal::CordRep::external() const");
    }
    puVar5 = (uint8_t *)pCVar3[1].length;
  }
  else {
    if ((bVar1 - 0xf9 < 7) || (bVar1 < 6)) {
      __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                    ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
    }
    puVar5 = pCVar3->storage;
  }
  sVar7._M_str = puVar5 + sVar4;
  sVar7._M_len = sVar2;
  return sVar7;
}

Assistant:

inline absl::string_view CordRepBtreeReader::Init(CordRepBtree* tree) {
  assert(tree != nullptr);
  const CordRep* edge = navigator_.InitFirst(tree);
  remaining_ = tree->length - edge->length;
  return EdgeData(edge);
}